

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

void __thiscall CChat::AddLine(CChat *this,char *pLine,int ClientID,int Mode,int TargetID)

{
  char *buffer;
  uint uVar1;
  CGameClient *pCVar2;
  IConsole *pIVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  int64 iVar7;
  char *pcVar8;
  int64 iVar9;
  char *pcVar10;
  ulong uVar11;
  int iVar12;
  char *pcVar13;
  long in_FS_OFFSET;
  char *pStr;
  char aBuf [1024];
  char *local_440;
  char local_438 [1024];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*pLine != '\0') && ((ClientID < 1 || (bVar5 = IsClientIgnored(this,ClientID), !bVar5)))) &&
     ((Mode != 3 ||
      (((-1 < (TargetID | ClientID) && (bVar5 = IsClientIgnored(this,TargetID), !bVar5)) &&
       (iVar12 = ((this->super_CComponent).m_pClient)->m_LocalClientID,
       iVar12 == ClientID || iVar12 == TargetID)))))) {
    iVar12 = 0x7f;
    pcVar10 = (char *)0x0;
    local_440 = pLine;
    do {
      pcVar13 = local_440;
      if (*local_440 == '\0') goto LAB_00137138;
      iVar6 = str_utf8_decode(&local_440);
      iVar6 = str_utf8_is_whitespace(iVar6);
      if (pcVar10 != (char *)0x0) {
        pcVar13 = pcVar10;
      }
      pcVar10 = (char *)0x0;
      if (iVar6 != 0) {
        pcVar10 = pcVar13;
      }
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
    *local_440 = '\0';
LAB_00137138:
    if (pcVar10 != (char *)0x0) {
      *pcVar10 = '\0';
    }
    if (*pLine == '\0') {
      bVar5 = false;
    }
    else {
      pcVar10 = pLine;
LAB_00137189:
      do {
        pcVar13 = pLine;
        if (*pcVar13 != '\0') {
          pLine = pcVar13 + 1;
          if (*pcVar13 != '\n') goto LAB_00137189;
          *pcVar13 = '\0';
          pcVar13 = pcVar13 + 1;
        }
        iVar12 = this->m_CurrentLine + ((this->m_CurrentLine + 1) / 0xfa) * -0xfa + 1;
        this->m_CurrentLine = iVar12;
        iVar7 = time_get();
        this->m_aLines[iVar12].m_Time = iVar7;
        this->m_aLines[iVar12].m_Size.field_1.y = -1.0;
        this->m_aLines[iVar12].m_ClientID = ClientID;
        this->m_aLines[iVar12].m_TargetID = TargetID;
        this->m_aLines[iVar12].m_Mode = Mode;
        this->m_aLines[iVar12].m_NameColor = -2;
        if (ClientID < 0 || Mode == 3) {
          bVar5 = false;
        }
        else {
          pCVar2 = (this->super_CComponent).m_pClient;
          iVar6 = pCVar2->m_LocalClientID;
          if ((iVar6 == ClientID) ||
             (pcVar8 = str_find_nocase(pcVar10,pCVar2->m_aClients[iVar6].m_aName),
             pcVar8 == (char *)0x0)) {
            bVar5 = false;
          }
          else {
            pCVar2 = (this->super_CComponent).m_pClient;
            iVar6 = str_length(pCVar2->m_aClients[pCVar2->m_LocalClientID].m_aName);
            if ((pcVar10 == pcVar8) || (pcVar8[-1] == ' ')) {
              bVar5 = (pcVar8[iVar6] & 0xdfU) == 0;
              if ((pcVar8[iVar6] == 0x3a) && ((pcVar8[(long)iVar6 + 1] & 0xdfU) == 0)) {
                bVar5 = true;
              }
            }
            else {
              bVar5 = false;
            }
            this->m_CompletionFav = ClientID;
          }
        }
        this->m_aLines[iVar12].m_Highlighted = bVar5;
        uVar11 = (ulong)(uint)ClientID;
        if (Mode == 3) {
          uVar1 = ClientID;
          if (((this->super_CComponent).m_pClient)->m_LocalClientID == ClientID) {
            uVar1 = TargetID;
          }
          uVar11 = (ulong)uVar1;
          if (TargetID < 0) {
            uVar11 = (ulong)(uint)ClientID;
          }
        }
        if (ClientID == -2) {
          this->m_aLines[iVar12].m_aName[0] = '\0';
          pcVar8 = anon_var_dwarf_48d67;
        }
        else if (ClientID == -1) {
          this->m_aLines[iVar12].m_aName[0] = '\0';
          pcVar8 = "*** %s";
        }
        else {
          pCVar2 = (this->super_CComponent).m_pClient;
          uVar1 = pCVar2->m_aClients[ClientID].m_Team;
          if (uVar1 == 0xffffffff) {
            this->m_aLines[iVar12].m_NameColor = -1;
          }
          if (uVar1 < 2 && ((pCVar2->m_GameInfo).m_GameFlags & 1) != 0) {
            this->m_aLines[iVar12].m_NameColor = uVar1;
          }
          str_format(this->m_aLines[iVar12].m_aName,0x41,"%s",pCVar2->m_aClients + (int)uVar11);
          pcVar8 = "%s";
        }
        buffer = this->m_aLines[iVar12].m_aText;
        str_format(buffer,0x200,pcVar8,pcVar10);
        str_format(local_438,0x400,"%2d: %s: %s",uVar11,this->m_aLines[iVar12].m_aName,buffer);
        pIVar3 = ((this->super_CComponent).m_pClient)->m_pConsole;
        pcVar10 = "";
        if (Mode - 1U < 3) {
          pcVar10 = *(char **)(&DAT_00213b70 + (ulong)(Mode - 1U) * 8);
        }
        (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])
                  (pIVar3,0,pcVar10,local_438,(ulong)(byte)(Mode == 3 | bVar5));
        pLine = pcVar13;
        pcVar10 = pcVar13;
      } while (*pcVar13 != '\0');
    }
    if ((Mode == 3) && (((this->super_CComponent).m_pClient)->m_LocalClientID != ClientID)) {
      this->m_LastWhisperFrom = ClientID;
    }
    if (((this->super_CComponent).m_pClient)->m_pConfig->m_ClShowChat != 0) {
      uVar11 = 0;
      if (-1 < ClientID) {
        uVar11 = (ulong)(2 - (byte)(Mode == 3 | bVar5));
      }
      iVar7 = time_get();
      lVar4 = this->m_aLastSoundPlayed[uVar11];
      iVar9 = time_freq();
      if ((float)iVar9 * 0.3 <= (float)(iVar7 - lVar4)) {
        CSounds::Play(((this->super_CComponent).m_pClient)->m_pSounds,0,
                      *(int *)(&DAT_001db24c + uVar11 * 4),0.0);
        this->m_aLastSoundPlayed[uVar11] = iVar7;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CChat::AddLine(const char *pLine, int ClientID, int Mode, int TargetID)
{
	if(*pLine == 0 || (ClientID > 0 && IsClientIgnored(ClientID)))
		return;

	if(Mode == CHAT_WHISPER)
	{
		if(ClientID < 0 || TargetID < 0 || IsClientIgnored(TargetID))
			return;
		// should be sender or receiver
		if(ClientID != m_pClient->m_LocalClientID && TargetID != m_pClient->m_LocalClientID)
			return;
	}

	// trim right and set maximum length to 128 utf8-characters
	int Length = 0;
	const char *pStr = pLine;
	const char *pEnd = 0;
	while(*pStr)
	{
		const char *pStrOld = pStr;
		int Code = str_utf8_decode(&pStr);

		// check if unicode is not empty
		if(!str_utf8_is_whitespace(Code))
		{
			pEnd = 0;
		}
		else if(pEnd == 0)
			pEnd = pStrOld;

		if(++Length >= 127)
		{
			*(const_cast<char *>(pStr)) = 0;
			break;
		}
	}
	if(pEnd != 0)
		*(const_cast<char *>(pEnd)) = 0;

	bool Highlighted = false;
	char *p = const_cast<char*>(pLine);
	while(*p)
	{
		pLine = p;
		// find line separator and strip multiline
		while(*p)
		{
			if(*p++ == '\n')
			{
				*(p-1) = 0;
				break;
			}
		}

		m_CurrentLine = (m_CurrentLine+1)%MAX_LINES;
		CLine *pCurLine = &m_aLines[m_CurrentLine];

		pCurLine->m_Time = time_get();
		pCurLine->m_Size.y = -1.0f;
		pCurLine->m_ClientID = ClientID;
		pCurLine->m_TargetID = TargetID;
		pCurLine->m_Mode = Mode;
		pCurLine->m_NameColor = -2;

		// check for highlighted name
		Highlighted = false;
		// do not highlight our own messages, whispers and system messages
		if(Mode != CHAT_WHISPER && ClientID >= 0 && ClientID != m_pClient->m_LocalClientID)
		{
			const char *pHL = str_find_nocase(pLine, m_pClient->m_aClients[m_pClient->m_LocalClientID].m_aName);
			if(pHL)
			{
				int Length = str_length(m_pClient->m_aClients[m_pClient->m_LocalClientID].m_aName);
				if((pLine == pHL || pHL[-1] == ' ')) // "" or " " before
				{
					if((pHL[Length] == 0 || pHL[Length] == ' ')) // "" or " " after
						Highlighted = true;
					if(pHL[Length] == ':' && (pHL[Length+1] == 0 || pHL[Length+1] == ' ')) // ":" or ": " after
						Highlighted = true;
				}
				m_CompletionFav = ClientID;
			}
		}

		pCurLine->m_Highlighted =  Highlighted;

		int NameCID = ClientID;
		if(Mode == CHAT_WHISPER && ClientID == m_pClient->m_LocalClientID && TargetID >= 0)
			NameCID = TargetID;

		if(ClientID == SERVER_MSG)
		{
			pCurLine->m_aName[0] = '\0';
			str_format(pCurLine->m_aText, sizeof(pCurLine->m_aText), "*** %s", pLine);
		}
		else if(ClientID == CLIENT_MSG)
		{
			pCurLine->m_aName[0] = '\0';
			str_format(pCurLine->m_aText, sizeof(pCurLine->m_aText), "— %s", pLine);
		}
		else
		{
			if(m_pClient->m_aClients[ClientID].m_Team == TEAM_SPECTATORS)
				pCurLine->m_NameColor = TEAM_SPECTATORS;

			if(m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_TEAMS)
			{
				if(m_pClient->m_aClients[ClientID].m_Team == TEAM_RED)
					pCurLine->m_NameColor = TEAM_RED;
				else if(m_pClient->m_aClients[ClientID].m_Team == TEAM_BLUE)
					pCurLine->m_NameColor = TEAM_BLUE;
			}

			str_format(pCurLine->m_aName, sizeof(pCurLine->m_aName), "%s", m_pClient->m_aClients[NameCID].m_aName);
			str_format(pCurLine->m_aText, sizeof(pCurLine->m_aText), "%s", pLine);
		}

		char aBuf[1024];
		str_format(aBuf, sizeof(aBuf), "%2d: %s: %s", NameCID, pCurLine->m_aName, pCurLine->m_aText);
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, GetModeName(Mode), aBuf, Highlighted || Mode == CHAT_WHISPER);
	}

	if(Mode == CHAT_WHISPER && m_pClient->m_LocalClientID != ClientID)
		m_LastWhisperFrom = ClientID; // we received a whisper

	// play sound
	if(Config()->m_ClShowChat)
	{
		int ChatType;
		if(ClientID < 0)
			ChatType = CHAT_SERVER;
		else if(Highlighted || Mode == CHAT_WHISPER)
			ChatType = CHAT_HIGHLIGHT;
		else
			ChatType = CHAT_CLIENT;

		const int64 Now = time_get();
		if(Now - m_aLastSoundPlayed[ChatType] >= time_freq() * 0.3f)
		{
			m_pClient->m_pSounds->Play(CSounds::CHN_GUI, GetChatSound(ChatType), 0);
			m_aLastSoundPlayed[ChatType] = Now;
		}
	}
}